

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

cupdlp_retcode
csr_alloc_matrix(CUPDLPcsr *csr,cupdlp_int nRows,cupdlp_int nCols,void *src,
                CUPDLP_MATRIX_FORMAT src_matrix_format)

{
  cupdlp_int *pcVar1;
  cupdlp_float *pcVar2;
  CUPDLPdense *in_RCX;
  int in_EDX;
  int in_ESI;
  CUPDLPcsr *in_RDI;
  int in_R8D;
  cupdlp_int nnz;
  cupdlp_retcode retcode;
  CUPDLPcsr *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  cupdlp_retcode cVar4;
  int iVar5;
  
  cVar4 = 0;
  iVar3 = 0;
  if (in_R8D == 0) {
    iVar3 = in_ESI * in_EDX;
  }
  else if (in_R8D == 1) {
    iVar3 = *(int *)&in_RCX->data;
  }
  else if (in_R8D == 2) {
    iVar3 = *(int *)&in_RCX->data;
  }
  iVar5 = in_R8D;
  pcVar1 = (cupdlp_int *)calloc((long)(in_ESI + 1),4);
  in_RDI->rowMatBeg = pcVar1;
  if (in_RDI->rowMatBeg == (cupdlp_int *)0x0) {
    cVar4 = 1;
  }
  else {
    pcVar1 = (cupdlp_int *)calloc((long)iVar3,4);
    in_RDI->rowMatIdx = pcVar1;
    if (in_RDI->rowMatIdx == (cupdlp_int *)0x0) {
      cVar4 = 1;
    }
    else {
      pcVar2 = (cupdlp_float *)calloc((long)iVar3,8);
      in_RDI->rowMatElem = pcVar2;
      if (in_RDI->rowMatElem == (cupdlp_float *)0x0) {
        cVar4 = 1;
      }
      else if (iVar5 == 0) {
        dense2csr(in_RDI,in_RCX);
      }
      else if (iVar5 == 1) {
        csr_copy((CUPDLPcsr *)CONCAT44(1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
      }
      else if (iVar5 == 2) {
        csc2csr((CUPDLPcsr *)CONCAT44(2,cVar4),(CUPDLPcsc *)CONCAT44(iVar3,in_R8D));
      }
    }
  }
  return cVar4;
}

Assistant:

cupdlp_retcode csr_alloc_matrix(CUPDLPcsr *csr, cupdlp_int nRows,
                                cupdlp_int nCols, void *src,
                                CUPDLP_MATRIX_FORMAT src_matrix_format) {
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_int nnz = 0;
  switch (src_matrix_format) {
    case DENSE:
      nnz = nRows * nCols;
      break;
    case CSR:
      nnz = ((CUPDLPcsr *)src)->nMatElem;
      break;
    case CSC:
      nnz = ((CUPDLPcsc *)src)->nMatElem;
      break;
    default:
      break;
  }
  // todo make sure this is right
  cupdlp_init_zero_vec_int(csr->rowMatBeg, nRows + 1);
  cupdlp_init_zero_vec_int(csr->rowMatIdx, nnz);
  cupdlp_init_zero_vec_double(csr->rowMatElem, nnz);

  switch (src_matrix_format) {
    case DENSE:
      dense2csr(csr, (CUPDLPdense *)src);
      break;
    case CSR:
      csr_copy(csr, (CUPDLPcsr *)src);
      break;
    case CSC:
      csc2csr(csr, (CUPDLPcsc *)src);
      break;
    default:
      break;
  }
exit_cleanup:
  return retcode;
}